

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

GenericStreamTextBasedSet * __thiscall
ASDCP::MXF::GenericStreamTextBasedSet::InitFromTLVSet
          (GenericStreamTextBasedSet *this,TLVReader *TLVSet)

{
  MDDEntry *value;
  MDDEntry *in_RDX;
  TLVReader local_80;
  
  if (TLVSet[1].super_MemIOReader.m_p != (byte_t *)0x0) {
    TextBasedObject::InitFromTLVSet(&this->super_TextBasedObject,TLVSet);
    if (-1 < *(int *)&(this->super_TextBasedObject).super_DescriptiveObject.super_InterchangeObject.
                      super_KLVPacket._vptr_KLVPacket) {
      value = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                               MDD_GenericStreamTextBasedSet_GenericStreamSID);
      TLVReader::ReadUi32(&local_80,in_RDX,(ui32_t *)value);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x1313,
                "virtual ASDCP::Result_t ASDCP::MXF::GenericStreamTextBasedSet::InitFromTLVSet(TLVReader &)"
               );
}

Assistant:

ASDCP::Result_t
GenericStreamTextBasedSet::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = TextBasedObject::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(GenericStreamTextBasedSet, GenericStreamSID));
  return result;
}